

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O0

void find_final_state(void)

{
  shifts *p;
  Yshort *to_state;
  int i;
  int goal;
  
  to_state._0_4_ = (*shift_table)->nshifts;
  do {
    to_state._0_4_ = (int)to_state + -1;
    if ((int)to_state < 0) {
      return;
    }
    final_state = (*shift_table)->shift[(int)to_state];
  } while (accessing_symbol[final_state] != ritem[1]);
  return;
}

Assistant:

void find_final_state()
{
    register int goal, i;
    register Yshort *to_state;
    register shifts *p;

    p = shift_table[0];
    to_state = p->shift;
    goal = ritem[1];
    for (i = p->nshifts - 1; i >= 0; --i)
    {
	final_state = to_state[i];
	if (accessing_symbol[final_state] == goal) break;
    }
}